

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::handleLoopAttributes
          (TParseContext *this,TAttributes *attributes,TIntermNode *node)

{
  _List_node_base *this_00;
  _List_node_base *p_Var1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  long lVar5;
  undefined8 uVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar7;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  TConstUnion *pTVar8;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  char *pcVar9;
  char *pcVar10;
  _func_int **pp_Var11;
  undefined8 *unaff_R14;
  bool bVar12;
  long local_40;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar2 = (*node->_vptr_TIntermNode[0xe])(node);
  local_40 = CONCAT44(extraout_var,iVar2);
  if (local_40 == 0) {
    iVar2 = (*node->_vptr_TIntermNode[6])();
    plVar4 = (long *)CONCAT44(extraout_var_00,iVar2);
    if (plVar4 == (long *)0x0) {
      local_40 = 0;
      bVar12 = false;
    }
    else {
      lVar5 = (**(code **)(*plVar4 + 400))(plVar4);
      unaff_R14 = *(undefined8 **)(lVar5 + 8);
      lVar5 = (**(code **)(*plVar4 + 400))(plVar4);
      if (unaff_R14 == *(undefined8 **)(lVar5 + 0x10)) {
        local_40 = 0;
      }
      else {
        do {
          local_40 = (**(code **)(*(long *)*unaff_R14 + 0x70))();
          if (local_40 != 0) break;
          unaff_R14 = unaff_R14 + 1;
          lVar5 = (**(code **)(*plVar4 + 400))(plVar4);
          local_40 = 0;
        } while (unaff_R14 != *(undefined8 **)(lVar5 + 0x10));
      }
      bVar12 = local_40 != 0;
    }
    if (!bVar12) {
      return;
    }
  }
  p_Var1 = (attributes->
           super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>).
           super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if ((_List_node_header *)p_Var1 ==
        &(attributes->
         super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>).
         super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
         ._M_impl._M_node) {
      return;
    }
    if (*(int *)&p_Var1[1]._M_next - 0x12U < 0x10) {
      this_00 = p_Var1 + 1;
      switch(*(int *)&p_Var1[1]._M_next) {
      case 0x12:
        if ((p_Var1[1]._M_prev == (_List_node_base *)0x0) ||
           (lVar5 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
           (int)((ulong)(*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8)) >> 3) < 1)) {
          *(undefined1 *)(local_40 + 0x39) = 1;
          break;
        }
        iVar2 = (**node->_vptr_TIntermNode)();
        uVar6 = CONCAT44(extraout_var_01,iVar2);
        pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar9 = "unroll";
LAB_003e83eb:
        pcVar10 = "expected no arguments";
        goto LAB_003e87d7;
      case 0x13:
        if ((p_Var1[1]._M_prev != (_List_node_base *)0x0) &&
           (lVar5 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
           0 < (int)((ulong)(*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8)) >> 3))) {
          iVar2 = (**node->_vptr_TIntermNode)();
          uVar6 = CONCAT44(extraout_var_05,iVar2);
          pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar9 = "dont_unroll";
          goto LAB_003e83eb;
        }
        *(undefined1 *)(local_40 + 0x3a) = 1;
        *(undefined8 *)(local_40 + 0x4c) = 0;
        break;
      default:
        goto switchD_003e822e_caseD_14;
      case 0x1b:
        if ((p_Var1[1]._M_prev != (_List_node_base *)0x0) &&
           (lVar5 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
           0 < (int)((ulong)(*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8)) >> 3))) {
          iVar2 = (**node->_vptr_TIntermNode)();
          uVar6 = CONCAT44(extraout_var_02,iVar2);
          pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar9 = "dependency_infinite";
          goto LAB_003e83eb;
        }
        *(undefined4 *)(local_40 + 0x3c) = 0xffffffff;
        break;
      case 0x1c:
        iVar2 = 0;
        unaff_R14 = (undefined8 *)0x170;
        if ((p_Var1[1]._M_prev == (_List_node_base *)0x0) ||
           (lVar5 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
           (*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8) & 0x7fffffff8U) != 8)) {
          pcVar9 = "expected a single integer argument";
LAB_003e8835:
          iVar3 = (**node->_vptr_TIntermNode)();
          bVar12 = false;
          (**(code **)((long)(this->super_TParseContextBase).super_TParseVersions.
                             _vptr_TParseVersions + (long)unaff_R14))
                    (this,iVar3,pcVar9,"dependency_length","");
        }
        else {
          iVar2 = 0;
          pTVar8 = TAttributeArgs::getConstUnion((TAttributeArgs *)this_00,EbtInt,0);
          pcVar9 = "expected a single integer argument";
          if (pTVar8 == (TConstUnion *)0x0) goto LAB_003e8835;
          iVar2 = (pTVar8->field_0).iConst;
          bVar12 = true;
          if (iVar2 < 1) {
            pcVar9 = "must be positive";
            unaff_R14 = (undefined8 *)0x168;
            goto LAB_003e8835;
          }
        }
        if (bVar12) {
          *(int *)(local_40 + 0x3c) = iVar2;
        }
        break;
      case 0x1d:
        if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv - 1 < 0x103ff) {
          iVar2 = (**node->_vptr_TIntermNode)();
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,CONCAT44(extraout_var_09,iVar2),
                     "attribute requires a SPIR-V 1.4 target-env","min_iterations","");
        }
        if ((p_Var1[1]._M_prev == (_List_node_base *)0x0) ||
           (lVar5 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
           (*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8) & 0x7fffffff8U) != 8)) {
LAB_003e8692:
          iVar2 = (**node->_vptr_TIntermNode)();
          unaff_R14 = (undefined8 *)0x0;
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,CONCAT44(extraout_var_10,iVar2),"expected a single integer argument",
                     "min_iterations","");
          bVar12 = false;
        }
        else {
          pTVar8 = TAttributeArgs::getConstUnion((TAttributeArgs *)this_00,EbtInt,0);
          if (pTVar8 != (TConstUnion *)0x0) {
            unaff_R14 = (undefined8 *)(ulong)(pTVar8->field_0).uConst;
          }
          bVar12 = true;
          if (pTVar8 == (TConstUnion *)0x0) goto LAB_003e8692;
        }
        if (bVar12) {
          *(int *)(local_40 + 0x40) = (int)unaff_R14;
        }
        break;
      case 0x1e:
        if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv - 1 < 0x103ff) {
          iVar2 = (**node->_vptr_TIntermNode)();
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,CONCAT44(extraout_var_03,iVar2),
                     "attribute requires a SPIR-V 1.4 target-env","max_iterations","");
        }
        if ((p_Var1[1]._M_prev == (_List_node_base *)0x0) ||
           (lVar5 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
           (*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8) & 0x7fffffff8U) != 8)) {
LAB_003e8356:
          iVar2 = (**node->_vptr_TIntermNode)();
          unaff_R14 = (undefined8 *)0x0;
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,CONCAT44(extraout_var_04,iVar2),"expected a single integer argument",
                     "max_iterations","");
          bVar12 = false;
        }
        else {
          pTVar8 = TAttributeArgs::getConstUnion((TAttributeArgs *)this_00,EbtInt,0);
          if (pTVar8 != (TConstUnion *)0x0) {
            unaff_R14 = (undefined8 *)(ulong)(pTVar8->field_0).uConst;
          }
          bVar12 = true;
          if (pTVar8 == (TConstUnion *)0x0) goto LAB_003e8356;
        }
        if (bVar12) {
          *(int *)(local_40 + 0x44) = (int)unaff_R14;
        }
        break;
      case 0x1f:
        if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv - 1 < 0x103ff) {
          iVar2 = (**node->_vptr_TIntermNode)();
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,CONCAT44(extraout_var_06,iVar2),
                     "attribute requires a SPIR-V 1.4 target-env","iteration_multiple","");
        }
        lVar5 = 0x170;
        if ((p_Var1[1]._M_prev == (_List_node_base *)0x0) ||
           (lVar7 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
           (*(long *)(lVar7 + 0x10) - *(long *)(lVar7 + 8) & 0x7fffffff8U) != 8)) {
          pcVar9 = "expected a single integer argument";
LAB_003e87ec:
          iVar2 = (**node->_vptr_TIntermNode)();
          unaff_R14 = (undefined8 *)0x0;
          (**(code **)((long)(this->super_TParseContextBase).super_TParseVersions.
                             _vptr_TParseVersions + lVar5))
                    (this,iVar2,pcVar9,"iteration_multiple","");
          bVar12 = false;
        }
        else {
          pTVar8 = TAttributeArgs::getConstUnion((TAttributeArgs *)this_00,EbtInt,0);
          if (pTVar8 != (TConstUnion *)0x0) {
            unaff_R14 = (undefined8 *)(ulong)(pTVar8->field_0).uConst;
          }
          pcVar9 = "expected a single integer argument";
          if (pTVar8 == (TConstUnion *)0x0) goto LAB_003e87ec;
          bVar12 = true;
          if ((int)unaff_R14 == 0) {
            lVar5 = 0x168;
            pcVar9 = "must be greater than or equal to 1";
            goto LAB_003e87ec;
          }
        }
        if (bVar12) {
          *(int *)(local_40 + 0x48) = (int)unaff_R14;
        }
        break;
      case 0x20:
        if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv - 1 < 0x103ff) {
          iVar2 = (**node->_vptr_TIntermNode)();
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,CONCAT44(extraout_var_07,iVar2),
                     "attribute requires a SPIR-V 1.4 target-env","peel_count","");
        }
        if ((p_Var1[1]._M_prev == (_List_node_base *)0x0) ||
           (lVar5 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
           (*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8) & 0x7fffffff8U) != 8)) {
LAB_003e8540:
          iVar2 = (**node->_vptr_TIntermNode)();
          unaff_R14 = (undefined8 *)0x0;
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,CONCAT44(extraout_var_08,iVar2),"expected a single integer argument",
                     "peel_count","");
          bVar12 = false;
        }
        else {
          pTVar8 = TAttributeArgs::getConstUnion((TAttributeArgs *)this_00,EbtInt,0);
          if (pTVar8 != (TConstUnion *)0x0) {
            unaff_R14 = (undefined8 *)(ulong)(pTVar8->field_0).uConst;
          }
          bVar12 = true;
          if (pTVar8 == (TConstUnion *)0x0) goto LAB_003e8540;
        }
        if (bVar12) {
          *(int *)(local_40 + 0x4c) = (int)unaff_R14;
LAB_003e87ab:
          *(undefined1 *)(local_40 + 0x3a) = 0;
        }
        break;
      case 0x21:
        if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv - 1 < 0x103ff) {
          iVar2 = (**node->_vptr_TIntermNode)();
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,CONCAT44(extraout_var_11,iVar2),
                     "attribute requires a SPIR-V 1.4 target-env","partial_count","");
        }
        if ((p_Var1[1]._M_prev == (_List_node_base *)0x0) ||
           (lVar5 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
           (*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8) & 0x7fffffff8U) != 8)) {
LAB_003e8765:
          iVar2 = (**node->_vptr_TIntermNode)();
          unaff_R14 = (undefined8 *)0x0;
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,CONCAT44(extraout_var_12,iVar2),"expected a single integer argument",
                     "partial_count","");
          bVar12 = false;
        }
        else {
          pTVar8 = TAttributeArgs::getConstUnion((TAttributeArgs *)this_00,EbtInt,0);
          if (pTVar8 != (TConstUnion *)0x0) {
            unaff_R14 = (undefined8 *)(ulong)(pTVar8->field_0).uConst;
          }
          bVar12 = true;
          if (pTVar8 == (TConstUnion *)0x0) goto LAB_003e8765;
        }
        if (bVar12) {
          *(int *)(local_40 + 0x50) = (int)unaff_R14;
          goto LAB_003e87ab;
        }
      }
    }
    else {
switchD_003e822e_caseD_14:
      iVar2 = (**node->_vptr_TIntermNode)();
      uVar6 = CONCAT44(extraout_var_13,iVar2);
      pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar10 = "attribute does not apply to a loop";
      pcVar9 = "";
LAB_003e87d7:
      (*pp_Var11[0x2e])(this,uVar6,pcVar10,pcVar9,"");
    }
    p_Var1 = p_Var1->_M_next;
  } while( true );
}

Assistant:

void TParseContext::handleLoopAttributes(const TAttributes& attributes, TIntermNode* node)
{
    TIntermLoop* loop = node->getAsLoopNode();
    if (loop == nullptr) {
        // the actual loop might be part of a sequence
        TIntermAggregate* agg = node->getAsAggregate();
        if (agg == nullptr)
            return;
        for (auto it = agg->getSequence().begin(); it != agg->getSequence().end(); ++it) {
            loop = (*it)->getAsLoopNode();
            if (loop != nullptr)
                break;
        }
        if (loop == nullptr)
            return;
    }

    for (auto it = attributes.begin(); it != attributes.end(); ++it) {

        const auto noArgument = [&](const char* feature) {
            if (it->size() > 0) {
                warn(node->getLoc(), "expected no arguments", feature, "");
                return false;
            }
            return true;
        };

        const auto positiveSignedArgument = [&](const char* feature, int& value) {
            if (it->size() == 1 && it->getInt(value)) {
                if (value <= 0) {
                    error(node->getLoc(), "must be positive", feature, "");
                    return false;
                }
            } else {
                warn(node->getLoc(), "expected a single integer argument", feature, "");
                return false;
            }
            return true;
        };

        const auto unsignedArgument = [&](const char* feature, unsigned int& uiValue) {
            int value;
            if (!(it->size() == 1 && it->getInt(value))) {
                warn(node->getLoc(), "expected a single integer argument", feature, "");
                return false;
            }
            uiValue = (unsigned int)value;
            return true;
        };

        const auto positiveUnsignedArgument = [&](const char* feature, unsigned int& uiValue) {
            int value;
            if (it->size() == 1 && it->getInt(value)) {
                if (value == 0) {
                    error(node->getLoc(), "must be greater than or equal to 1", feature, "");
                    return false;
                }
            } else {
                warn(node->getLoc(), "expected a single integer argument", feature, "");
                return false;
            }
            uiValue = (unsigned int)value;
            return true;
        };

        const auto spirv14 = [&](const char* feature) {
            if (spvVersion.spv > 0 && spvVersion.spv < EShTargetSpv_1_4)
                warn(node->getLoc(), "attribute requires a SPIR-V 1.4 target-env", feature, "");
        };

        int value = 0;
        unsigned uiValue = 0;
        switch (it->name) {
        case EatUnroll:
            if (noArgument("unroll"))
                loop->setUnroll();
            break;
        case EatLoop:
            if (noArgument("dont_unroll"))
                loop->setDontUnroll();
            break;
        case EatDependencyInfinite:
            if (noArgument("dependency_infinite"))
                loop->setLoopDependency(TIntermLoop::dependencyInfinite);
            break;
        case EatDependencyLength:
            if (positiveSignedArgument("dependency_length", value))
                loop->setLoopDependency(value);
            break;
        case EatMinIterations:
            spirv14("min_iterations");
            if (unsignedArgument("min_iterations", uiValue))
                loop->setMinIterations(uiValue);
            break;
        case EatMaxIterations:
            spirv14("max_iterations");
            if (unsignedArgument("max_iterations", uiValue))
                loop->setMaxIterations(uiValue);
            break;
        case EatIterationMultiple:
            spirv14("iteration_multiple");
            if (positiveUnsignedArgument("iteration_multiple", uiValue))
                loop->setIterationMultiple(uiValue);
            break;
        case EatPeelCount:
            spirv14("peel_count");
            if (unsignedArgument("peel_count", uiValue))
                loop->setPeelCount(uiValue);
            break;
        case EatPartialCount:
            spirv14("partial_count");
            if (unsignedArgument("partial_count", uiValue))
                loop->setPartialCount(uiValue);
            break;
        default:
            warn(node->getLoc(), "attribute does not apply to a loop", "", "");
            break;
        }
    }
}